

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

PaddingLayerParams_PaddingReplication * __thiscall
CoreML::Specification::PaddingLayerParams::mutable_replication(PaddingLayerParams *this)

{
  bool bVar1;
  PaddingLayerParams_PaddingReplication *this_00;
  PaddingLayerParams *this_local;
  
  bVar1 = has_replication(this);
  if (!bVar1) {
    clear_PaddingType(this);
    set_has_replication(this);
    this_00 = (PaddingLayerParams_PaddingReplication *)operator_new(0x18);
    PaddingLayerParams_PaddingReplication::PaddingLayerParams_PaddingReplication(this_00);
    (this->PaddingType_).replication_ = this_00;
  }
  return (PaddingLayerParams_PaddingReplication *)(this->PaddingType_).constant_;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams_PaddingReplication* PaddingLayerParams::mutable_replication() {
  if (!has_replication()) {
    clear_PaddingType();
    set_has_replication();
    PaddingType_.replication_ = new ::CoreML::Specification::PaddingLayerParams_PaddingReplication;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PaddingLayerParams.replication)
  return PaddingType_.replication_;
}